

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.h
# Opt level: O0

void __thiscall ImVector<char>::resize(ImVector<char> *this,int new_size,char *v)

{
  char *in_RDX;
  int in_ESI;
  ImVector<char> *in_RDI;
  int n;
  int local_1c;
  undefined4 in_stack_fffffffffffffff0;
  
  if (in_RDI->Capacity < in_ESI) {
    _grow_capacity(in_RDI,in_ESI);
    reserve((ImVector<char> *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),
            (int)((ulong)in_RDX >> 0x20));
  }
  if (in_RDI->Size < in_ESI) {
    for (local_1c = in_RDI->Size; local_1c < in_ESI; local_1c = local_1c + 1) {
      in_RDI->Data[local_1c] = *in_RDX;
    }
  }
  in_RDI->Size = in_ESI;
  return;
}

Assistant:

inline void         resize(int new_size, const T& v)    { if (new_size > Capacity) reserve(_grow_capacity(new_size)); if (new_size > Size) for (int n = Size; n < new_size; n++) memcpy(&Data[n], &v, sizeof(v)); Size = new_size; }